

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmTarget * __thiscall
cmMakefile::AddUtilityCommand
          (cmMakefile *this,string *utilityName,bool excludeFromAll,char *workingDirectory,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *byproducts,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,cmCustomCommandLines *commandLines,bool escapeOldStyle,char *comment,
          bool uses_terminal,bool command_expand_lists)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *byproducts_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *workingDir;
  bool bVar5;
  cmTarget *this_00;
  char *pcVar6;
  cmSourceFile *pcVar7;
  reference sourceName;
  allocator local_191;
  string local_190;
  cmSourceFile *local_170;
  cmSourceFile *out;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_160;
  const_iterator o;
  string local_150;
  cmSourceFile *local_130;
  cmSourceFile *sf;
  string local_120;
  undefined1 local_f9;
  undefined1 local_f8 [7];
  bool no_replace;
  string no_main_dependency;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  forced;
  undefined1 local_b8 [8];
  string force;
  allocator local_81;
  string local_80;
  cmTarget *local_60;
  cmTarget *target;
  bool command_expand_lists_local;
  bool uses_terminal_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_50;
  bool escapeOldStyle_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *depends_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *byproducts_local;
  char *workingDirectory_local;
  string *psStack_30;
  bool excludeFromAll_local;
  string *utilityName_local;
  cmMakefile *this_local;
  
  target._7_1_ = escapeOldStyle;
  target._6_1_ = uses_terminal;
  target._5_1_ = command_expand_lists;
  pvStack_50 = depends;
  depends_local = byproducts;
  byproducts_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)workingDirectory;
  workingDirectory_local._7_1_ = excludeFromAll;
  psStack_30 = utilityName;
  utilityName_local = (string *)this;
  this_00 = AddNewTarget(this,UTILITY,utilityName);
  local_60 = this_00;
  if ((workingDirectory_local._7_1_ & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80,"EXCLUDE_FROM_ALL",&local_81);
    cmTarget::SetProperty(this_00,&local_80,"TRUE");
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
  }
  if (comment == (char *)0x0) {
    comment = "";
  }
  bVar5 = std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::empty
                    (&commandLines->
                      super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
  if ((!bVar5) ||
     (bVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(pvStack_50), !bVar5)) {
    pcVar6 = GetCurrentBinaryDirectory(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_b8,pcVar6,
               (allocator *)
               ((long)&forced.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&forced.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pcVar6 = cmake::GetCMakeFilesDirectory();
    std::__cxx11::string::operator+=((string *)local_b8,pcVar6);
    std::__cxx11::string::operator+=((string *)local_b8,"/");
    std::__cxx11::string::operator+=((string *)local_b8,(string *)psStack_30);
    pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&no_main_dependency.field_2 + 8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(pvVar1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar1,(value_type *)local_b8);
    std::__cxx11::string::string((string *)local_f8);
    workingDir = byproducts_local;
    byproducts_00 = depends_local;
    pvVar1 = pvStack_50;
    bVar4 = target._7_1_;
    bVar3 = target._6_1_;
    bVar2 = target._5_1_;
    local_f9 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_120,"",(allocator *)((long)&sf + 7));
    AddCustomCommandToOutput
              (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&no_main_dependency.field_2 + 8),byproducts_00,pvVar1,
               (string *)local_f8,commandLines,comment,(char *)workingDir,false,(bool)(bVar4 & 1),
               (bool)(bVar3 & 1),(bool)(bVar2 & 1),&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator((allocator<char> *)((long)&sf + 7));
    pcVar7 = cmTarget::AddSourceCMP0049(local_60,(string *)local_b8);
    local_130 = pcVar7;
    if (pcVar7 == (cmSourceFile *)0x0) {
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Error("Could not get source file entry for ",pcVar6,(char *)0x0,(char *)0x0);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_150,"SYMBOLIC",(allocator *)((long)&o._M_current + 7));
      cmSourceFile::SetProperty(pcVar7,&local_150,"1");
      std::__cxx11::string::~string((string *)&local_150);
      std::allocator<char>::~allocator((allocator<char> *)((long)&o._M_current + 7));
    }
    local_160._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(depends_local);
    while( true ) {
      out = (cmSourceFile *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(depends_local);
      bVar5 = __gnu_cxx::operator!=
                        (&local_160,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&out);
      if (!bVar5) break;
      sourceName = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_160);
      pcVar7 = GetOrCreateSource(this,sourceName,true);
      local_170 = pcVar7;
      if (pcVar7 != (cmSourceFile *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_190,"GENERATED",&local_191);
        cmSourceFile::SetProperty(pcVar7,&local_190,"1");
        std::__cxx11::string::~string((string *)&local_190);
        std::allocator<char>::~allocator((allocator<char> *)&local_191);
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_160);
    }
    std::__cxx11::string::~string((string *)local_f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&no_main_dependency.field_2 + 8));
    std::__cxx11::string::~string((string *)local_b8);
  }
  return local_60;
}

Assistant:

cmTarget* cmMakefile::AddUtilityCommand(
  const std::string& utilityName, bool excludeFromAll,
  const char* workingDirectory, const std::vector<std::string>& byproducts,
  const std::vector<std::string>& depends,
  const cmCustomCommandLines& commandLines, bool escapeOldStyle,
  const char* comment, bool uses_terminal, bool command_expand_lists)
{
  // Create a target instance for this utility.
  cmTarget* target = this->AddNewTarget(cmStateEnums::UTILITY, utilityName);
  if (excludeFromAll) {
    target->SetProperty("EXCLUDE_FROM_ALL", "TRUE");
  }
  if (!comment) {
    // Use an empty comment to avoid generation of default comment.
    comment = "";
  }

  // Store the custom command in the target.
  if (!commandLines.empty() || !depends.empty()) {
    std::string force = this->GetCurrentBinaryDirectory();
    force += cmake::GetCMakeFilesDirectory();
    force += "/";
    force += utilityName;
    std::vector<std::string> forced;
    forced.push_back(force);
    std::string no_main_dependency;
    bool no_replace = false;
    this->AddCustomCommandToOutput(
      forced, byproducts, depends, no_main_dependency, commandLines, comment,
      workingDirectory, no_replace, escapeOldStyle, uses_terminal,
      command_expand_lists);
    cmSourceFile* sf = target->AddSourceCMP0049(force);

    // The output is not actually created so mark it symbolic.
    if (sf) {
      sf->SetProperty("SYMBOLIC", "1");
    } else {
      cmSystemTools::Error("Could not get source file entry for ",
                           force.c_str());
    }

    // Always create the byproduct sources and mark them generated.
    for (std::vector<std::string>::const_iterator o = byproducts.begin();
         o != byproducts.end(); ++o) {
      if (cmSourceFile* out = this->GetOrCreateSource(*o, true)) {
        out->SetProperty("GENERATED", "1");
      }
    }
  }
  return target;
}